

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::CombinationalStmtBlock::clone
          (CombinationalStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StmtBlock *block;
  undefined1 local_28 [8];
  shared_ptr<kratos::CombinationalStmtBlock> stmt;
  CombinationalStmtBlock *this_local;
  
  stmt.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  std::make_shared<kratos::CombinationalStmtBlock>();
  block = &std::__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                      local_28)->super_StmtBlock;
  StmtBlock::clone_block((StmtBlock *)__fn,block);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::CombinationalStmtBlock,void>
            ((shared_ptr<kratos::Stmt> *)this,(shared_ptr<kratos::CombinationalStmtBlock> *)local_28
            );
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> CombinationalStmtBlock::clone() const {
    auto stmt = std::make_shared<CombinationalStmtBlock>();
    clone_block(stmt.get());
    return stmt;
}